

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::ReplaceChars(char *str,char *toreplace,char replacement)

{
  char *local_30;
  char *ptr2;
  char *ptr;
  char replacement_local;
  char *toreplace_local;
  char *str_local;
  
  ptr2 = str;
  if (str != (char *)0x0) {
    for (; local_30 = toreplace, *ptr2 != '\0'; ptr2 = ptr2 + 1) {
      for (; *local_30 != '\0'; local_30 = local_30 + 1) {
        if (*ptr2 == *local_30) {
          *ptr2 = replacement;
        }
      }
    }
  }
  return str;
}

Assistant:

char* SystemTools::ReplaceChars(char* str, const char* toreplace,
                                char replacement)
{
  if (str) {
    char* ptr = str;
    while (*ptr) {
      const char* ptr2 = toreplace;
      while (*ptr2) {
        if (*ptr == *ptr2) {
          *ptr = replacement;
        }
        ++ptr2;
      }
      ++ptr;
    }
  }
  return str;
}